

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::api::json::DecodePsbtLockingScript::~DecodePsbtLockingScript(DecodePsbtLockingScript *this)

{
  JsonClassBase<cfd::api::json::DecodePsbtLockingScript> *in_RDI;
  
  in_RDI->_vptr_JsonClassBase = (_func_int **)&PTR__DecodePsbtLockingScript_0057fed8;
  std::__cxx11::string::~string((string *)(in_RDI + 0x13));
  std::__cxx11::string::~string((string *)(in_RDI + 0xf));
  std::__cxx11::string::~string((string *)(in_RDI + 0xb));
  std::__cxx11::string::~string((string *)(in_RDI + 7));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x472aa5);
  core::JsonClassBase<cfd::api::json::DecodePsbtLockingScript>::~JsonClassBase(in_RDI);
  return;
}

Assistant:

virtual ~DecodePsbtLockingScript() {
    // do nothing
  }